

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O3

Continuation __thiscall wasm::HeapType::getContinuation(HeapType *this)

{
  ulong uVar1;
  
  uVar1 = this->id;
  if ((0x7c < uVar1) && (*(int *)(uVar1 + 0x30) == 4)) {
    return (Continuation)(HeapType)*(uintptr_t *)(uVar1 + 0x38);
  }
  __assert_fail("isContinuation()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                ,0x39a,"Continuation wasm::HeapType::getContinuation() const");
}

Assistant:

constexpr bool isBasic() const { return id <= _last_basic_type; }